

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QXmlStreamWriter::writeAttributes(QXmlStreamWriter *this,QXmlStreamAttributes *attributes)

{
  QXmlStreamAttribute *attr;
  QXmlStreamAttribute *attribute;
  long lVar1;
  
  lVar1 = (attributes->super_QList<QXmlStreamAttribute>).d.size;
  if (lVar1 != 0) {
    attribute = (attributes->super_QList<QXmlStreamAttribute>).d.ptr;
    lVar1 = lVar1 * 0x68;
    do {
      writeAttribute(this,attribute);
      attribute = attribute + 1;
      lVar1 = lVar1 + -0x68;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }